

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

bool __thiscall
TMapIterator<int,_FPlayerColorSet,_TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>_>
::NextPair(TMapIterator<int,_FPlayerColorSet,_TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>_>
           *this,Pair **pair)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Pair *pPVar4;
  
  uVar3 = (ulong)this->Position;
  uVar1 = this->Map->Size;
  if (this->Position < uVar1) {
    pPVar4 = (Pair *)&this->Map->Nodes[uVar3].Pair;
    do {
      if (*(long *)(pPVar4[-1].Value.Extra + 4) != 1) {
        *pair = pPVar4;
        this->Position = (int)uVar3 + 1;
        return true;
      }
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      this->Position = uVar2;
      pPVar4 = (Pair *)&pPVar4[1].Value.Lump;
    } while (uVar2 < uVar1);
  }
  return false;
}

Assistant:

bool NextPair(typename MapType::Pair *&pair)
	{
		if (Position >= Map.Size)
		{
			return false;
		}
		do
		{
			if (!Map.Nodes[Position].IsNil())
			{
				pair = reinterpret_cast<typename MapType::Pair *>(&Map.Nodes[Position].Pair);
				Position += 1;
				return true;
			}
		} while (++Position < Map.Size);
		return false;
	}